

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int uv_pipe_listen(uv_pipe_t *handle,int backlog,uv_connection_cb cb)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = (handle->io_watcher).fd;
  if (iVar1 == -1) {
    iVar1 = -0x16;
  }
  else {
    iVar1 = listen(iVar1,backlog);
    if (iVar1 == 0) {
      handle->connection_cb = cb;
      (handle->io_watcher).cb = uv__server_io;
      uv__io_start(handle->loop,&handle->io_watcher,1);
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
  }
  return iVar1;
}

Assistant:

int uv_pipe_listen(uv_pipe_t* handle, int backlog, uv_connection_cb cb) {
  if (uv__stream_fd(handle) == -1)
    return -EINVAL;

#if defined(__MVS__)
  /* On zOS, backlog=0 has undefined behaviour */
  if (backlog == 0)
    backlog = 1;
  else if (backlog < 0)
    backlog = SOMAXCONN;
#endif

  if (listen(uv__stream_fd(handle), backlog))
    return -errno;

  handle->connection_cb = cb;
  handle->io_watcher.cb = uv__server_io;
  uv__io_start(handle->loop, &handle->io_watcher, POLLIN);
  return 0;
}